

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool EmitAsConstantArray(ParseNode *pnodeArr,ByteCodeGenerator *byteCodeGenerator)

{
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppFVar4;
  ParseNodeArrLit *pPVar5;
  Type funcInfo;
  
  if ((pnodeArr == (ParseNode *)0x0) || (pnodeArr->nop != knopArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc3,"(pnodeArr && pnodeArr->nop == knopArray)",
                       "pnodeArr && pnodeArr->nop == knopArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
    funcInfo = (FuncInfo *)0x0;
  }
  else {
    ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    funcInfo = *ppFVar4;
  }
  bVar2 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  pPVar5 = ParseNode::AsParseNodeArrLit(pnodeArr);
  if (bVar2) {
    bVar2 = (bool)((pPVar5->field_0x20 & 4) >> 2);
  }
  else if ((pPVar5->field_0x20 & 1) == 0) {
    bVar2 = false;
  }
  else {
    pPVar5 = ParseNode::AsParseNodeArrLit(pnodeArr);
    bVar2 = 1 < pPVar5->count;
  }
  return bVar2;
}

Assistant:

bool EmitAsConstantArray(ParseNode *pnodeArr, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnodeArr && pnodeArr->nop == knopArray);

    // TODO: We shouldn't have to handle an empty funcinfo stack here, but there seem to be issues
    // with the stack involved nested deferral. Remove this null check when those are resolved.
    if (CreateNativeArrays(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
    {
        return pnodeArr->AsParseNodeArrLit()->arrayOfNumbers;
    }

    return pnodeArr->AsParseNodeArrLit()->arrayOfTaggedInts && pnodeArr->AsParseNodeArrLit()->count > 1;
}